

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmTarget::StrictTargetComparison::operator()(StrictTargetComparison *this,cmTarget *t1,cmTarget *t2)

{
  char *pcVar1;
  int iVar2;
  string *psVar3;
  cmMakefile *pcVar4;
  
  psVar3 = cmTarget::GetName_abi_cxx11_(t1);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  psVar3 = cmTarget::GetName_abi_cxx11_(t2);
  iVar2 = strcmp(pcVar1,(psVar3->_M_dataplus)._M_p);
  if (iVar2 == 0) {
    pcVar4 = GetMakefile(t1);
    psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    pcVar4 = GetMakefile(t2);
    psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    iVar2 = strcmp(pcVar1,(psVar3->_M_dataplus)._M_p);
  }
  return SUB41((uint)iVar2 >> 0x1f,0);
}

Assistant:

bool cmTarget::StrictTargetComparison::operator()(cmTarget const* t1,
                                                  cmTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0) {
    return strcmp(t1->GetMakefile()->GetCurrentBinaryDirectory().c_str(),
                  t2->GetMakefile()->GetCurrentBinaryDirectory().c_str()) < 0;
  }
  return nameResult < 0;
}